

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

void do_crop_ext_flat(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
                     JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
                     jvirt_barray_ptr *dst_coef_arrays)

{
  JCOEF JVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  jpeg_component_info *pjVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  JBLOCKARRAY ppaJVar11;
  jpeg_memory_mgr *pjVar12;
  JBLOCKARRAY ppaJVar13;
  uint num_blocks;
  JBLOCKROW paJVar14;
  uint uVar15;
  ulong uVar17;
  jvirt_barray_ptr pjVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar55;
  undefined1 in_XMM6 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar56;
  undefined1 auVar54 [16];
  int iVar57;
  int iVar60;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar61 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar62 [16];
  long lVar64;
  undefined1 auVar63 [16];
  ulong uVar16;
  
  uVar2 = srcinfo->output_width;
  iVar3 = dstinfo->max_h_samp_factor;
  if (0 < dstinfo->num_components) {
    uVar4 = srcinfo->output_height;
    iVar5 = dstinfo->max_v_samp_factor;
    lVar21 = 0;
    do {
      pjVar7 = dstinfo->comp_info;
      if (pjVar7[lVar21].height_in_blocks != 0) {
        iVar6 = pjVar7[lVar21].v_samp_factor;
        num_blocks = pjVar7[lVar21].h_samp_factor * (uVar2 / (uint)(iVar3 << 3));
        uVar22 = iVar6 * y_crop_offset;
        uVar15 = pjVar7[lVar21].h_samp_factor * x_crop_offset;
        uVar16 = (ulong)uVar15;
        uVar15 = uVar15 + num_blocks;
        lVar24 = uVar16 - 1;
        auVar25._8_4_ = (int)lVar24;
        auVar25._0_8_ = lVar24;
        auVar25._12_4_ = (int)((ulong)lVar24 >> 0x20);
        uVar23 = 0;
        do {
          ppaJVar11 = (*srcinfo->mem->access_virt_barray)
                                ((j_common_ptr)srcinfo,dst_coef_arrays[lVar21],uVar23,
                                 pjVar7[lVar21].v_samp_factor,1);
          if (srcinfo->output_height < dstinfo->image_height) {
            if ((uVar22 <= uVar23) &&
               (uVar23 < iVar6 * (uVar4 / (uint)(iVar5 << 3) + y_crop_offset))) {
              pjVar12 = srcinfo->mem;
              pjVar18 = src_coef_arrays[lVar21];
              uVar8 = -uVar22;
              goto LAB_0013ff7b;
            }
            if (0 < pjVar7[lVar21].v_samp_factor) {
              lVar24 = 0;
              do {
                memset(ppaJVar11[lVar24],0,(ulong)pjVar7[lVar21].width_in_blocks << 7);
                lVar24 = lVar24 + 1;
              } while (lVar24 < pjVar7[lVar21].v_samp_factor);
            }
          }
          else {
            pjVar12 = srcinfo->mem;
            pjVar18 = src_coef_arrays[lVar21];
            uVar8 = uVar22;
LAB_0013ff7b:
            ppaJVar13 = (*pjVar12->access_virt_barray)
                                  ((j_common_ptr)srcinfo,pjVar18,uVar23 + uVar8,
                                   pjVar7[lVar21].v_samp_factor,0);
            if (0 < pjVar7[lVar21].v_samp_factor) {
              lVar24 = 0;
              do {
                if (uVar16 != 0) {
                  memset(ppaJVar11[lVar24],0,uVar16 * 0x80);
                  auVar10 = _DAT_00158060;
                  auVar9 = _DAT_00158050;
                  auVar35._8_4_ = 0xffffffff;
                  auVar35._0_8_ = 0xffffffffffffffff;
                  auVar35._12_4_ = 0xffffffff;
                  JVar1 = (*ppaJVar13[lVar24])[0];
                  paJVar14 = ppaJVar11[lVar24] + 7;
                  uVar17 = uVar16 + 7 & 0xfffffffffffffff8;
                  auVar26 = _DAT_00158000;
                  auVar31 = _DAT_00158040;
                  auVar50 = _DAT_00158030;
                  auVar54 = _DAT_00158020;
                  do {
                    auVar44 = auVar25 ^ auVar9;
                    auVar46 = auVar26 ^ auVar9;
                    iVar55 = auVar44._0_4_;
                    iVar57 = -(uint)(iVar55 < auVar46._0_4_);
                    iVar56 = auVar44._4_4_;
                    auVar47._4_4_ = -(uint)(iVar56 < auVar46._4_4_);
                    iVar43 = auVar44._8_4_;
                    iVar60 = -(uint)(iVar43 < auVar46._8_4_);
                    iVar28 = auVar44._12_4_;
                    auVar47._12_4_ = -(uint)(iVar28 < auVar46._12_4_);
                    auVar52._4_4_ = iVar57;
                    auVar52._0_4_ = iVar57;
                    auVar52._8_4_ = iVar60;
                    auVar52._12_4_ = iVar60;
                    auVar61 = pshuflw(in_XMM8,auVar52,0xe8);
                    auVar44._4_4_ = -(uint)(auVar46._4_4_ == iVar56);
                    auVar44._12_4_ = -(uint)(auVar46._12_4_ == iVar28);
                    auVar44._0_4_ = auVar44._4_4_;
                    auVar44._8_4_ = auVar44._12_4_;
                    auVar62 = pshuflw(in_XMM9,auVar44,0xe8);
                    auVar47._0_4_ = auVar47._4_4_;
                    auVar47._8_4_ = auVar47._12_4_;
                    auVar46 = pshuflw(auVar61,auVar47,0xe8);
                    auVar46 = (auVar46 | auVar62 & auVar61) ^ auVar35;
                    auVar46 = packssdw(auVar46,auVar46);
                    if ((auVar46 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      paJVar14[-7][0] = JVar1;
                    }
                    auVar47 = auVar44 & auVar52 | auVar47;
                    auVar44 = packssdw(auVar47,auVar47);
                    auVar44 = packssdw(auVar44 ^ auVar35,auVar44 ^ auVar35);
                    if ((auVar44._0_4_ >> 0x10 & 1) != 0) {
                      paJVar14[-6][0] = JVar1;
                    }
                    auVar44 = auVar31 ^ auVar9;
                    iVar57 = -(uint)(iVar55 < auVar44._0_4_);
                    auVar58._4_4_ = -(uint)(iVar56 < auVar44._4_4_);
                    iVar60 = -(uint)(iVar43 < auVar44._8_4_);
                    auVar58._12_4_ = -(uint)(iVar28 < auVar44._12_4_);
                    auVar46._4_4_ = iVar57;
                    auVar46._0_4_ = iVar57;
                    auVar46._8_4_ = iVar60;
                    auVar46._12_4_ = iVar60;
                    auVar51._4_4_ = -(uint)(auVar44._4_4_ == iVar56);
                    auVar51._12_4_ = -(uint)(auVar44._12_4_ == iVar28);
                    auVar51._0_4_ = auVar51._4_4_;
                    auVar51._8_4_ = auVar51._12_4_;
                    auVar58._0_4_ = auVar58._4_4_;
                    auVar58._8_4_ = auVar58._12_4_;
                    auVar44 = auVar51 & auVar46 | auVar58;
                    auVar44 = packssdw(auVar44,auVar44);
                    auVar44 = packssdw(auVar44 ^ auVar35,auVar44 ^ auVar35);
                    if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      paJVar14[-5][0] = JVar1;
                    }
                    auVar46 = pshufhw(auVar46,auVar46,0x84);
                    auVar52 = pshufhw(auVar51,auVar51,0x84);
                    auVar47 = pshufhw(auVar46,auVar58,0x84);
                    auVar46 = (auVar47 | auVar52 & auVar46) ^ auVar35;
                    auVar46 = packssdw(auVar46,auVar46);
                    if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      paJVar14[-4][0] = JVar1;
                    }
                    auVar46 = auVar50 ^ auVar9;
                    iVar57 = -(uint)(iVar55 < auVar46._0_4_);
                    auVar49._4_4_ = -(uint)(iVar56 < auVar46._4_4_);
                    iVar60 = -(uint)(iVar43 < auVar46._8_4_);
                    auVar49._12_4_ = -(uint)(iVar28 < auVar46._12_4_);
                    auVar53._4_4_ = iVar57;
                    auVar53._0_4_ = iVar57;
                    auVar53._8_4_ = iVar60;
                    auVar53._12_4_ = iVar60;
                    auVar44 = pshuflw(auVar44,auVar53,0xe8);
                    auVar48._4_4_ = -(uint)(auVar46._4_4_ == iVar56);
                    auVar48._12_4_ = -(uint)(auVar46._12_4_ == iVar28);
                    auVar48._0_4_ = auVar48._4_4_;
                    auVar48._8_4_ = auVar48._12_4_;
                    in_XMM9 = pshuflw(auVar62 & auVar61,auVar48,0xe8);
                    in_XMM9 = in_XMM9 & auVar44;
                    auVar49._0_4_ = auVar49._4_4_;
                    auVar49._8_4_ = auVar49._12_4_;
                    auVar44 = pshuflw(auVar44,auVar49,0xe8);
                    auVar44 = (auVar44 | in_XMM9) ^ auVar35;
                    auVar44 = packssdw(auVar44,auVar44);
                    if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      paJVar14[-3][0] = JVar1;
                    }
                    auVar49 = auVar48 & auVar53 | auVar49;
                    auVar44 = packssdw(auVar49,auVar49);
                    auVar44 = packssdw(auVar44 ^ auVar35,auVar44 ^ auVar35);
                    if ((auVar44 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      paJVar14[-2][0] = JVar1;
                    }
                    auVar44 = auVar54 ^ auVar9;
                    auVar59._0_4_ = -(uint)(iVar55 < auVar44._0_4_);
                    auVar59._4_4_ = -(uint)(iVar56 < auVar44._4_4_);
                    auVar59._8_4_ = -(uint)(iVar43 < auVar44._8_4_);
                    auVar59._12_4_ = -(uint)(iVar28 < auVar44._12_4_);
                    auVar62._4_4_ = auVar59._0_4_;
                    auVar62._0_4_ = auVar59._0_4_;
                    auVar62._8_4_ = auVar59._8_4_;
                    auVar62._12_4_ = auVar59._8_4_;
                    iVar55 = -(uint)(auVar44._4_4_ == iVar56);
                    iVar56 = -(uint)(auVar44._12_4_ == iVar28);
                    auVar61._4_4_ = iVar55;
                    auVar61._0_4_ = iVar55;
                    auVar61._8_4_ = iVar56;
                    auVar61._12_4_ = iVar56;
                    in_XMM6._4_4_ = auVar59._4_4_;
                    in_XMM6._0_4_ = auVar59._4_4_;
                    in_XMM6._8_4_ = auVar59._12_4_;
                    in_XMM6._12_4_ = auVar59._12_4_;
                    in_XMM8 = auVar61 & auVar62 | in_XMM6;
                    auVar44 = packssdw(auVar59,in_XMM8);
                    auVar44 = packssdw(auVar44 ^ auVar35,auVar44 ^ auVar35);
                    if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      paJVar14[-1][0] = JVar1;
                    }
                    auVar46 = pshufhw(auVar62,auVar62,0x84);
                    auVar44 = pshufhw(auVar61,auVar61,0x84);
                    auVar47 = pshufhw(auVar46,in_XMM6,0x84);
                    in_XMM5 = (auVar47 | auVar44 & auVar46) ^ auVar35;
                    auVar44 = packssdw(auVar44 & auVar46,in_XMM5);
                    if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      (*paJVar14)[0] = JVar1;
                    }
                    lVar19 = auVar26._8_8_;
                    lVar20 = auVar10._0_8_;
                    auVar26._0_8_ = auVar26._0_8_ + lVar20;
                    lVar64 = auVar10._8_8_;
                    auVar26._8_8_ = lVar19 + lVar64;
                    lVar19 = auVar31._8_8_;
                    auVar31._0_8_ = auVar31._0_8_ + lVar20;
                    auVar31._8_8_ = lVar19 + lVar64;
                    lVar19 = auVar50._8_8_;
                    auVar50._0_8_ = auVar50._0_8_ + lVar20;
                    auVar50._8_8_ = lVar19 + lVar64;
                    lVar19 = auVar54._8_8_;
                    auVar54._0_8_ = auVar54._0_8_ + lVar20;
                    auVar54._8_8_ = lVar19 + lVar64;
                    paJVar14 = paJVar14 + 8;
                    uVar17 = uVar17 - 8;
                  } while (uVar17 != 0);
                }
                jcopy_block_row(ppaJVar13[lVar24],ppaJVar11[lVar24] + uVar16,num_blocks);
                if (uVar15 < pjVar7[lVar21].width_in_blocks) {
                  memset(ppaJVar11[lVar24] + uVar16 + num_blocks,0,
                         (ulong)(pjVar7[lVar21].width_in_blocks - uVar15) << 7);
                  auVar26 = _DAT_00158050;
                  in_XMM9 = _DAT_00158040;
                  in_XMM8 = _DAT_00158030;
                  auVar10 = _DAT_00158020;
                  auVar9 = _DAT_00158000;
                  auVar63._8_4_ = 0xffffffff;
                  auVar63._0_8_ = 0xffffffffffffffff;
                  auVar63._12_4_ = 0xffffffff;
                  if (uVar15 < pjVar7[lVar21].width_in_blocks) {
                    JVar1 = ppaJVar13[lVar24][num_blocks - 1][0];
                    paJVar14 = ppaJVar11[lVar24];
                    lVar19 = (ulong)pjVar7[lVar21].width_in_blocks - (ulong)uVar15;
                    lVar20 = lVar19 + -1;
                    auVar27._8_4_ = (int)lVar20;
                    auVar27._0_8_ = lVar20;
                    auVar27._12_4_ = (int)((ulong)lVar20 >> 0x20);
                    auVar27 = auVar27 ^ _DAT_00158050;
                    uVar17 = 0;
                    do {
                      lVar20 = uVar17 + uVar15;
                      auVar29._8_4_ = (int)uVar17;
                      auVar29._0_8_ = uVar17;
                      auVar29._12_4_ = (int)(uVar17 >> 0x20);
                      auVar31 = (auVar29 | auVar9) ^ auVar26;
                      iVar55 = auVar27._0_4_;
                      iVar57 = -(uint)(iVar55 < auVar31._0_4_);
                      iVar56 = auVar27._4_4_;
                      auVar33._4_4_ = -(uint)(iVar56 < auVar31._4_4_);
                      iVar43 = auVar27._8_4_;
                      iVar60 = -(uint)(iVar43 < auVar31._8_4_);
                      iVar28 = auVar27._12_4_;
                      auVar33._12_4_ = -(uint)(iVar28 < auVar31._12_4_);
                      auVar39._4_4_ = iVar57;
                      auVar39._0_4_ = iVar57;
                      auVar39._8_4_ = iVar60;
                      auVar39._12_4_ = iVar60;
                      auVar50 = pshuflw(in_XMM5,auVar39,0xe8);
                      auVar32._4_4_ = -(uint)(auVar31._4_4_ == iVar56);
                      auVar32._12_4_ = -(uint)(auVar31._12_4_ == iVar28);
                      auVar32._0_4_ = auVar32._4_4_;
                      auVar32._8_4_ = auVar32._12_4_;
                      auVar54 = pshuflw(in_XMM6,auVar32,0xe8);
                      auVar33._0_4_ = auVar33._4_4_;
                      auVar33._8_4_ = auVar33._12_4_;
                      auVar31 = pshuflw(auVar50,auVar33,0xe8);
                      auVar31 = (auVar31 | auVar54 & auVar50) ^ auVar63;
                      auVar31 = packssdw(auVar31,auVar31);
                      if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        paJVar14[lVar20][0] = JVar1;
                      }
                      auVar33 = auVar32 & auVar39 | auVar33;
                      auVar31 = packssdw(auVar33,auVar33);
                      auVar31 = packssdw(auVar31 ^ auVar63,auVar31 ^ auVar63);
                      if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
                        paJVar14[lVar20 + 1][0] = JVar1;
                      }
                      auVar31 = (auVar29 | in_XMM9) ^ auVar26;
                      iVar57 = -(uint)(iVar55 < auVar31._0_4_);
                      auVar45._4_4_ = -(uint)(iVar56 < auVar31._4_4_);
                      iVar60 = -(uint)(iVar43 < auVar31._8_4_);
                      auVar45._12_4_ = -(uint)(iVar28 < auVar31._12_4_);
                      auVar34._4_4_ = iVar57;
                      auVar34._0_4_ = iVar57;
                      auVar34._8_4_ = iVar60;
                      auVar34._12_4_ = iVar60;
                      auVar40._4_4_ = -(uint)(auVar31._4_4_ == iVar56);
                      auVar40._12_4_ = -(uint)(auVar31._12_4_ == iVar28);
                      auVar40._0_4_ = auVar40._4_4_;
                      auVar40._8_4_ = auVar40._12_4_;
                      auVar45._0_4_ = auVar45._4_4_;
                      auVar45._8_4_ = auVar45._12_4_;
                      auVar31 = auVar40 & auVar34 | auVar45;
                      auVar31 = packssdw(auVar31,auVar31);
                      auVar31 = packssdw(auVar31 ^ auVar63,auVar31 ^ auVar63);
                      if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        paJVar14[lVar20 + 2][0] = JVar1;
                      }
                      auVar35 = pshufhw(auVar34,auVar34,0x84);
                      auVar46 = pshufhw(auVar40,auVar40,0x84);
                      auVar44 = pshufhw(auVar35,auVar45,0x84);
                      auVar35 = (auVar44 | auVar46 & auVar35) ^ auVar63;
                      auVar35 = packssdw(auVar35,auVar35);
                      if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        paJVar14[lVar20 + 3][0] = JVar1;
                      }
                      auVar35 = (auVar29 | in_XMM8) ^ auVar26;
                      iVar57 = -(uint)(iVar55 < auVar35._0_4_);
                      auVar37._4_4_ = -(uint)(iVar56 < auVar35._4_4_);
                      iVar60 = -(uint)(iVar43 < auVar35._8_4_);
                      auVar37._12_4_ = -(uint)(iVar28 < auVar35._12_4_);
                      auVar41._4_4_ = iVar57;
                      auVar41._0_4_ = iVar57;
                      auVar41._8_4_ = iVar60;
                      auVar41._12_4_ = iVar60;
                      auVar31 = pshuflw(auVar31,auVar41,0xe8);
                      auVar36._4_4_ = -(uint)(auVar35._4_4_ == iVar56);
                      auVar36._12_4_ = -(uint)(auVar35._12_4_ == iVar28);
                      auVar36._0_4_ = auVar36._4_4_;
                      auVar36._8_4_ = auVar36._12_4_;
                      in_XMM6 = pshuflw(auVar54 & auVar50,auVar36,0xe8);
                      in_XMM6 = in_XMM6 & auVar31;
                      auVar37._0_4_ = auVar37._4_4_;
                      auVar37._8_4_ = auVar37._12_4_;
                      auVar31 = pshuflw(auVar31,auVar37,0xe8);
                      auVar31 = (auVar31 | in_XMM6) ^ auVar63;
                      in_XMM5 = packssdw(auVar31,auVar31);
                      if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        paJVar14[lVar20 + 4][0] = JVar1;
                      }
                      auVar37 = auVar36 & auVar41 | auVar37;
                      auVar31 = packssdw(auVar37,auVar37);
                      auVar31 = packssdw(auVar31 ^ auVar63,auVar31 ^ auVar63);
                      if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        paJVar14[lVar20 + 5][0] = JVar1;
                      }
                      auVar31 = (auVar29 | auVar10) ^ auVar26;
                      iVar55 = -(uint)(iVar55 < auVar31._0_4_);
                      auVar42._4_4_ = -(uint)(iVar56 < auVar31._4_4_);
                      iVar43 = -(uint)(iVar43 < auVar31._8_4_);
                      auVar42._12_4_ = -(uint)(iVar28 < auVar31._12_4_);
                      auVar38._4_4_ = iVar55;
                      auVar38._0_4_ = iVar55;
                      auVar38._8_4_ = iVar43;
                      auVar38._12_4_ = iVar43;
                      auVar30._4_4_ = -(uint)(auVar31._4_4_ == iVar56);
                      auVar30._12_4_ = -(uint)(auVar31._12_4_ == iVar28);
                      auVar30._0_4_ = auVar30._4_4_;
                      auVar30._8_4_ = auVar30._12_4_;
                      auVar42._0_4_ = auVar42._4_4_;
                      auVar42._8_4_ = auVar42._12_4_;
                      auVar31 = auVar30 & auVar38 | auVar42;
                      auVar31 = packssdw(auVar31,auVar31);
                      auVar31 = packssdw(auVar31 ^ auVar63,auVar31 ^ auVar63);
                      if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        paJVar14[lVar20 + 6][0] = JVar1;
                      }
                      auVar50 = pshufhw(auVar38,auVar38,0x84);
                      auVar31 = pshufhw(auVar30,auVar30,0x84);
                      auVar54 = pshufhw(auVar50,auVar42,0x84);
                      auVar31 = packssdw(auVar31 & auVar50,(auVar54 | auVar31 & auVar50) ^ auVar63);
                      if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        paJVar14[lVar20 + 7][0] = JVar1;
                      }
                      uVar17 = uVar17 + 8;
                    } while ((lVar19 + 7U & 0xfffffffffffffff8) != uVar17);
                  }
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 < pjVar7[lVar21].v_samp_factor);
            }
          }
          uVar23 = uVar23 + pjVar7[lVar21].v_samp_factor;
        } while (uVar23 < pjVar7[lVar21].height_in_blocks);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < dstinfo->num_components);
  }
  return;
}

Assistant:

LOCAL(void)
do_crop_ext_flat(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                 JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
                 jvirt_barray_ptr *src_coef_arrays,
                 jvirt_barray_ptr *dst_coef_arrays)
/* Crop.  This is only used when no rotate/flip is requested with the crop.
 * Extension: The destination width is larger than the source, and we fill in
 * the expanded region with the DC coefficient of the adjacent block.  Note
 * that we also have to fill partial iMCUs at the right and bottom edge of the
 * source image area in this case.
 */
{
  JDIMENSION MCU_cols, MCU_rows, comp_width, comp_height;
  JDIMENSION dst_blk_x, dst_blk_y, x_crop_blocks, y_crop_blocks;
  int ci, offset_y;
  JCOEF dc;
  JBLOCKARRAY src_buffer, dst_buffer;
  jpeg_component_info *compptr;

  MCU_cols = srcinfo->output_width /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);
  MCU_rows = srcinfo->output_height /
             (dstinfo->max_v_samp_factor * dstinfo_min_DCT_v_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    comp_height = MCU_rows * compptr->v_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      if (dstinfo->_jpeg_height > srcinfo->output_height) {
        if (dst_blk_y < y_crop_blocks ||
            dst_blk_y >= y_crop_blocks + comp_height) {
          for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
            MEMZERO(dst_buffer[offset_y],
                    compptr->width_in_blocks * sizeof(JBLOCK));
          }
          continue;
        }
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y - y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
           FALSE);
      } else {
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y + y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
          FALSE);
      }
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        if (x_crop_blocks > 0) {
          MEMZERO(dst_buffer[offset_y], x_crop_blocks * sizeof(JBLOCK));
          dc = src_buffer[offset_y][0][0];
          for (dst_blk_x = 0; dst_blk_x < x_crop_blocks; dst_blk_x++) {
            dst_buffer[offset_y][dst_blk_x][0] = dc;
          }
        }
        jcopy_block_row(src_buffer[offset_y],
                        dst_buffer[offset_y] + x_crop_blocks, comp_width);
        if (compptr->width_in_blocks > x_crop_blocks + comp_width) {
          MEMZERO(dst_buffer[offset_y] + x_crop_blocks + comp_width,
                  (compptr->width_in_blocks - x_crop_blocks - comp_width) *
                  sizeof(JBLOCK));
          dc = src_buffer[offset_y][comp_width - 1][0];
          for (dst_blk_x = x_crop_blocks + comp_width;
               dst_blk_x < compptr->width_in_blocks; dst_blk_x++) {
            dst_buffer[offset_y][dst_blk_x][0] = dc;
          }
        }
      }
    }
  }
}